

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zgssvx.c
# Opt level: O3

void zgssvx(superlu_options_t *options,SuperMatrix *A,int *perm_c,int *perm_r,int *etree,char *equed
           ,double *R,double *C,SuperMatrix *L,SuperMatrix *U,void *work,int_t lwork,SuperMatrix *B,
           SuperMatrix *X,double *recip_pivot_growth,double *rcond,double *ferr,double *berr,
           GlobalLU_t *Glu,mem_usage_t *mem_usage,SuperLUStat_t *stat,int_t *info)

{
  double dVar1;
  char cVar2;
  uint uVar3;
  trans_t tVar4;
  fact_t fVar5;
  yes_no_t yVar6;
  int iVar7;
  int *piVar8;
  int *piVar9;
  double *pdVar10;
  int_t *piVar11;
  undefined8 uVar12;
  bool bVar13;
  char *pcVar14;
  int iVar15;
  ulong uVar16;
  SuperMatrix *A_00;
  int iVar17;
  long lVar18;
  ulong uVar19;
  int iVar20;
  long lVar21;
  ulong uVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  double in_XMM1_Qa;
  double dVar29;
  double dVar30;
  trans_t local_c4;
  char norm [1];
  int info1;
  double local_a0;
  long local_98;
  long local_90;
  int *local_88;
  double rowcnd;
  double colcnd;
  int local_6c;
  char *local_68;
  long local_60;
  double amax;
  SuperMatrix AC;
  
  piVar8 = (int *)B->Store;
  piVar9 = (int *)X->Store;
  lVar25 = *(long *)(piVar8 + 2);
  local_90 = *(long *)(piVar9 + 2);
  local_98 = (long)*piVar8;
  local_60 = (long)*piVar9;
  uVar3 = B->ncol;
  uVar16 = (ulong)uVar3;
  *info = 0;
  tVar4 = options->Trans;
  bVar26 = tVar4 == NOTRANS;
  fVar5 = options->Fact;
  yVar6 = options->Equil;
  local_88 = perm_r;
  if (fVar5 == FACTORED) {
    cVar2 = *equed;
    bVar27 = true;
    if (cVar2 == 'R') {
LAB_0010f036:
      bVar28 = cVar2 == 'B';
    }
    else {
      bVar27 = cVar2 == 'B';
      bVar28 = true;
      if (cVar2 != 'C') goto LAB_0010f036;
    }
    dVar30 = dmach("Safe minimum");
    in_XMM0_Da = SUB84(dVar30,0);
    in_XMM0_Db = (undefined4)((ulong)dVar30 >> 0x20);
    in_XMM1_Qa = 1.0 / dVar30;
  }
  else {
    *equed = 'N';
    bVar27 = false;
    bVar28 = false;
  }
  iVar15 = -1;
  if (((options->Fact < 4) && (options->Trans < (CONJ|TRANS))) && (options->Equil < 2)) {
    iVar17 = A->nrow;
    iVar15 = -2;
    if (((-1 < (long)iVar17) && (iVar17 == A->ncol)) &&
       (((A->Stype & ~SLU_NR) == SLU_NC && ((A->Dtype == SLU_Z && (A->Mtype == SLU_GE)))))) {
      if ((options->Fact != FACTORED) || (bVar28 || bVar27)) {
        if (bVar27) {
          if (iVar17 == 0) {
            iVar15 = -7;
            if (0.0 < in_XMM1_Qa) {
LAB_0010f185:
              rowcnd = 1.0;
              goto LAB_0010f197;
            }
          }
          else {
            dVar29 = 0.0;
            lVar18 = 0;
            dVar30 = in_XMM1_Qa;
            do {
              dVar1 = R[lVar18];
              if (dVar1 <= dVar30) {
                dVar30 = dVar1;
              }
              if (dVar29 <= dVar1) {
                dVar29 = dVar1;
              }
              lVar18 = lVar18 + 1;
            } while (iVar17 != lVar18);
            iVar15 = -7;
            if (0.0 < dVar30) {
              if (iVar17 == 0) goto LAB_0010f185;
              if (dVar30 <= (double)CONCAT44(in_XMM0_Db,in_XMM0_Da)) {
                dVar30 = (double)CONCAT44(in_XMM0_Db,in_XMM0_Da);
              }
              if (in_XMM1_Qa <= dVar29) {
                dVar29 = in_XMM1_Qa;
              }
              rowcnd = dVar30 / dVar29;
              goto LAB_0010f197;
            }
          }
        }
        else {
LAB_0010f197:
          iVar17 = *info;
          if (!bVar28) goto LAB_0010f205;
          if (iVar17 != 0) goto LAB_0010f0c3;
          iVar17 = A->nrow;
          if ((long)iVar17 < 1) {
            iVar15 = -8;
            if (0.0 < in_XMM1_Qa) {
LAB_0010f38d:
              colcnd = 1.0;
              goto LAB_0010f20d;
            }
          }
          else {
            dVar29 = 0.0;
            lVar18 = 0;
            dVar30 = in_XMM1_Qa;
            do {
              dVar1 = C[lVar18];
              if (dVar1 <= dVar30) {
                dVar30 = dVar1;
              }
              if (dVar29 <= dVar1) {
                dVar29 = dVar1;
              }
              lVar18 = lVar18 + 1;
            } while (iVar17 != lVar18);
            iVar15 = -8;
            if (0.0 < dVar30) {
              if (iVar17 < 1) goto LAB_0010f38d;
              if (dVar30 <= (double)CONCAT44(in_XMM0_Db,in_XMM0_Da)) {
                dVar30 = (double)CONCAT44(in_XMM0_Db,in_XMM0_Da);
              }
              if (in_XMM1_Qa <= dVar29) {
                dVar29 = in_XMM1_Qa;
              }
              colcnd = dVar30 / dVar29;
LAB_0010f20d:
              iVar17 = -0xc;
              if (lwork < -1) {
LAB_0010f25d:
                *info = iVar17;
                bVar13 = false;
              }
              else {
                iVar17 = -0xd;
                if (B->ncol < 0) goto LAB_0010f25d;
                bVar13 = true;
                if (B->ncol != 0) {
                  iVar15 = 0;
                  if (0 < A->nrow) {
                    iVar15 = A->nrow;
                  }
                  if ((((*piVar8 < iVar15) || (B->Stype != SLU_DN)) || (B->Dtype != SLU_Z)) ||
                     (B->Mtype != SLU_GE)) goto LAB_0010f25d;
                }
                iVar17 = 0;
              }
              iVar7 = X->ncol;
              iVar15 = -0xe;
              if (-1 < iVar7) {
                if (iVar7 != 0) {
                  iVar20 = 0;
                  if (0 < A->nrow) {
                    iVar20 = A->nrow;
                  }
                  if (((*piVar9 < iVar20) || (B->ncol != 0 && B->ncol != iVar7)) ||
                     ((X->Stype != SLU_DN || ((X->Dtype != SLU_Z || (X->Mtype != SLU_GE))))))
                  goto LAB_0010f0be;
                }
                if (!bVar13) goto LAB_0010f0c3;
                local_68 = equed;
                iVar15 = sp_ienv(1);
                local_a0 = (double)CONCAT44(local_a0._4_4_,iVar15);
                local_6c = sp_ienv(2);
                pdVar10 = stat->utime;
                if (A->Stype == SLU_NR) {
                  bVar26 = tVar4 != NOTRANS;
                  local_c4 = (trans_t)(tVar4 == NOTRANS);
                  piVar11 = (int_t *)A->Store;
                  A_00 = (SuperMatrix *)superlu_malloc(0x20);
                  zCreate_CompCol_Matrix
                            (A_00,A->ncol,A->nrow,*piVar11,*(doublecomplex **)(piVar11 + 2),
                             *(int_t **)(piVar11 + 4),*(int_t **)(piVar11 + 6),SLU_NC,A->Dtype,
                             A->Mtype);
                }
                else {
                  local_c4 = options->Trans;
                  A_00 = A;
                }
                if ((fVar5 == FACTORED) || (yVar6 != YES)) {
                  if (fVar5 == FACTORED) goto LAB_0010f59b;
                }
                else {
                  dVar30 = SuperLU_timer_();
                  zgsequ(A_00,R,C,&rowcnd,&colcnd,&amax,&info1);
                  pcVar14 = local_68;
                  if (info1 == 0) {
                    zlaqgs(A_00,R,C,rowcnd,colcnd,amax,local_68);
                    cVar2 = *pcVar14;
                    bVar27 = true;
                    if (cVar2 != 'R') {
                      bVar27 = cVar2 == 'B';
                      bVar28 = true;
                      if (cVar2 == 'C') goto LAB_0010f479;
                    }
                    bVar28 = cVar2 == 'B';
                  }
LAB_0010f479:
                  dVar29 = SuperLU_timer_();
                  pdVar10[4] = dVar29 - dVar30;
                }
                dVar30 = SuperLU_timer_();
                if ((options->ColPerm != MY_PERMC) && (options->Fact == DOFACT)) {
                  get_perm_c(options->ColPerm,A_00,perm_c);
                }
                dVar29 = SuperLU_timer_();
                *pdVar10 = dVar29 - dVar30;
                dVar30 = SuperLU_timer_();
                sp_preorder(options,A_00,perm_c,etree,&AC);
                dVar29 = SuperLU_timer_();
                pdVar10[3] = dVar29 - dVar30;
                dVar30 = SuperLU_timer_();
                zgstrf(options,&AC,local_6c,local_a0._0_4_,etree,work,lwork,perm_c,local_88,L,U,Glu,
                       stat,info);
                dVar29 = SuperLU_timer_();
                pdVar10[7] = dVar29 - dVar30;
                if (lwork == -1) {
                  mem_usage->total_needed = (float)(*info - A->ncol);
                  return;
                }
LAB_0010f59b:
                iVar15 = *info;
                if (0 < iVar15) {
                  if (A->ncol < iVar15) {
                    return;
                  }
                  dVar30 = zPivotGrowth(iVar15,A_00,perm_c,L,U);
                  *recip_pivot_growth = dVar30;
                  return;
                }
                if (options->PivotGrowth != NO) {
                  dVar30 = zPivotGrowth(A->ncol,A_00,perm_c,L,U);
                  *recip_pivot_growth = dVar30;
                }
                if (options->ConditionNumber != NO) {
                  local_a0 = SuperLU_timer_();
                  norm[0] = 'I';
                  if (bVar26) {
                    norm[0] = '1';
                  }
                  dVar30 = zlangs(norm,A_00);
                  zgscon(norm,L,U,dVar30,rcond,stat,&info1);
                  dVar30 = SuperLU_timer_();
                  pdVar10[0x10] = dVar30 - local_a0;
                }
                if (0 < (int)uVar3) {
                  if (bVar26) {
                    if (bVar27) {
                      uVar3 = A->nrow;
                      lVar18 = lVar25 + 8;
                      uVar22 = 0;
                      do {
                        if (0 < (int)uVar3) {
                          lVar24 = 0;
                          do {
                            *(double *)(lVar18 + -8 + lVar24 * 2) =
                                 *(double *)(lVar18 + -8 + lVar24 * 2) *
                                 *(double *)((long)R + lVar24);
                            *(double *)(lVar18 + lVar24 * 2) =
                                 *(double *)(lVar18 + lVar24 * 2) * *(double *)((long)R + lVar24);
                            lVar24 = lVar24 + 8;
                          } while ((ulong)uVar3 << 3 != lVar24);
                        }
                        uVar22 = uVar22 + 1;
                        lVar18 = lVar18 + local_98 * 0x10;
                      } while (uVar22 != uVar16);
                    }
                  }
                  else if (bVar28) {
                    uVar3 = A->nrow;
                    lVar18 = lVar25 + 8;
                    uVar22 = 0;
                    do {
                      if (0 < (int)uVar3) {
                        lVar24 = 0;
                        do {
                          *(double *)(lVar18 + -8 + lVar24 * 2) =
                               *(double *)(lVar18 + -8 + lVar24 * 2) * *(double *)((long)C + lVar24)
                          ;
                          *(double *)(lVar18 + lVar24 * 2) =
                               *(double *)(lVar18 + lVar24 * 2) * *(double *)((long)C + lVar24);
                          lVar24 = lVar24 + 8;
                        } while ((ulong)uVar3 << 3 != lVar24);
                      }
                      uVar22 = uVar22 + 1;
                      lVar18 = lVar18 + local_98 * 0x10;
                    } while (uVar22 != uVar16);
                  }
                  uVar19 = (ulong)(uint)B->nrow;
                  lVar24 = local_60 * 0x10;
                  uVar22 = 0;
                  lVar18 = local_90;
                  do {
                    if (0 < (int)uVar19) {
                      lVar21 = 0;
                      lVar23 = 0;
                      do {
                        uVar12 = ((undefined8 *)(lVar25 + lVar21))[1];
                        *(undefined8 *)(lVar18 + lVar21) = *(undefined8 *)(lVar25 + lVar21);
                        ((undefined8 *)(lVar18 + lVar21))[1] = uVar12;
                        lVar23 = lVar23 + 1;
                        uVar19 = (ulong)B->nrow;
                        lVar21 = lVar21 + 0x10;
                      } while (lVar23 < (long)uVar19);
                    }
                    uVar22 = uVar22 + 1;
                    lVar25 = lVar25 + local_98 * 0x10;
                    lVar18 = lVar18 + lVar24;
                  } while (uVar22 != uVar16);
                  dVar30 = SuperLU_timer_();
                  zgstrs(local_c4,L,U,perm_c,local_88,X,stat,&info1);
                  dVar29 = SuperLU_timer_();
                  pdVar10[0x11] = dVar29 - dVar30;
                  dVar30 = SuperLU_timer_();
                  if (options->IterRefine == NOREFINE) {
                    uVar22 = 0;
                    do {
                      berr[uVar22] = 1.0;
                      ferr[uVar22] = 1.0;
                      uVar22 = uVar22 + 1;
                    } while (uVar16 != uVar22);
                  }
                  else {
                    zgsrfs(local_c4,A_00,L,U,perm_c,local_88,local_68,R,C,B,X,ferr,berr,stat,&info1)
                    ;
                  }
                  dVar29 = SuperLU_timer_();
                  pdVar10[0x12] = dVar29 - dVar30;
                  if (bVar26) {
                    if (bVar28) {
                      uVar3 = A->nrow;
                      lVar25 = local_90 + 8;
                      uVar22 = 0;
                      do {
                        if (0 < (int)uVar3) {
                          lVar18 = 0;
                          do {
                            *(double *)(lVar25 + -8 + lVar18 * 2) =
                                 *(double *)(lVar25 + -8 + lVar18 * 2) *
                                 *(double *)((long)C + lVar18);
                            *(double *)(lVar25 + lVar18 * 2) =
                                 *(double *)(lVar25 + lVar18 * 2) * *(double *)((long)C + lVar18);
                            lVar18 = lVar18 + 8;
                          } while ((ulong)uVar3 << 3 != lVar18);
                        }
                        uVar22 = uVar22 + 1;
                        lVar25 = lVar25 + lVar24;
                      } while (uVar22 != uVar16);
                    }
                  }
                  else if (bVar27) {
                    uVar3 = A->nrow;
                    lVar25 = local_90 + 8;
                    uVar22 = 0;
                    do {
                      if (0 < (int)uVar3) {
                        lVar18 = 0;
                        do {
                          *(double *)(lVar25 + -8 + lVar18 * 2) =
                               *(double *)(lVar25 + -8 + lVar18 * 2) * *(double *)((long)R + lVar18)
                          ;
                          *(double *)(lVar25 + lVar18 * 2) =
                               *(double *)(lVar25 + lVar18 * 2) * *(double *)((long)R + lVar18);
                          lVar18 = lVar18 + 8;
                        } while ((ulong)uVar3 << 3 != lVar18);
                      }
                      uVar22 = uVar22 + 1;
                      lVar25 = lVar25 + lVar24;
                    } while (uVar22 != uVar16);
                  }
                }
                if ((options->ConditionNumber != NO) &&
                   (dVar30 = *rcond, dVar29 = dmach("E"), dVar30 < dVar29)) {
                  *info = A->ncol + 1;
                }
                if (fVar5 != FACTORED) {
                  zQuerySpace(L,U,mem_usage);
                  Destroy_CompCol_Permuted(&AC);
                }
                if (A->Stype != SLU_NR) {
                  return;
                }
                Destroy_SuperMatrix_Store(A_00);
                superlu_free(A_00);
                return;
              }
            }
          }
        }
      }
      else {
        iVar15 = -6;
        if (*equed == 'N') {
          iVar17 = *info;
LAB_0010f205:
          if (iVar17 != 0) goto LAB_0010f0c3;
          goto LAB_0010f20d;
        }
      }
    }
  }
LAB_0010f0be:
  *info = iVar15;
  iVar17 = iVar15;
LAB_0010f0c3:
  AC.Stype = -iVar17;
  input_error("zgssvx",(int *)&AC);
  return;
}

Assistant:

void
zgssvx(superlu_options_t *options, SuperMatrix *A, int *perm_c, int *perm_r,
       int *etree, char *equed, double *R, double *C,
       SuperMatrix *L, SuperMatrix *U, void *work, int_t lwork,
       SuperMatrix *B, SuperMatrix *X, double *recip_pivot_growth, 
       double *rcond, double *ferr, double *berr, 
       GlobalLU_t *Glu, mem_usage_t *mem_usage, SuperLUStat_t *stat, int_t *info )
{

    DNformat  *Bstore, *Xstore;
    doublecomplex    *Bmat, *Xmat;
    int       ldb, ldx, nrhs;
    SuperMatrix *AA;/* A in SLU_NC format used by the factorization routine.*/
    SuperMatrix AC; /* Matrix postmultiplied by Pc */
    int       colequ, equil, nofact, notran, rowequ, permc_spec;
    trans_t   trant;
    char      norm[1];
    int       i, j, info1;
    double    amax, anorm, bignum, smlnum, colcnd, rowcnd, rcmax, rcmin;
    int       relax, panel_size;
    double    t0;      /* temporary time */
    double    *utime;

    /* External functions */
    extern double zlangs(char *, SuperMatrix *);

    Bstore = B->Store;
    Xstore = X->Store;
    Bmat   = Bstore->nzval;
    Xmat   = Xstore->nzval;
    ldb    = Bstore->lda;
    ldx    = Xstore->lda;
    nrhs   = B->ncol;

    *info = 0;
    nofact = (options->Fact != FACTORED);
    equil = (options->Equil == YES);
    notran = (options->Trans == NOTRANS);
    if ( nofact ) {
	*(unsigned char *)equed = 'N';
	rowequ = FALSE;
	colequ = FALSE;
    } else {
	rowequ = strncmp(equed, "R", 1)==0 || strncmp(equed, "B", 1)==0;
	colequ = strncmp(equed, "C", 1)==0 || strncmp(equed, "B", 1)==0;
	smlnum = dmach("Safe minimum");   /* lamch_("Safe minimum"); */
	bignum = 1. / smlnum;
    }

#if 0
printf("dgssvx: Fact=%4d, Trans=%4d, equed=%c\n",
       options->Fact, options->Trans, *equed);
#endif

    /* Test the input parameters */
    if ( (options->Fact != DOFACT && options->Fact != SamePattern &&
	  options->Fact != SamePattern_SameRowPerm &&
	  options->Fact != FACTORED) || 
	 (options->Trans != NOTRANS && options->Trans != TRANS && 
	  options->Trans != CONJ) ||
	 (options->Equil != NO && options->Equil != YES) )
	 *info = -1;
    else if ( A->nrow != A->ncol || A->nrow < 0 ||
	      (A->Stype != SLU_NC && A->Stype != SLU_NR) ||
	      A->Dtype != SLU_Z || A->Mtype != SLU_GE )
	*info = -2;
    else if ( options->Fact == FACTORED &&
	     !(rowequ || colequ || strncmp(equed, "N", 1)==0) )
	*info = -6;
    else {
	if (rowequ) {
	    rcmin = bignum;
	    rcmax = 0.;
	    for (j = 0; j < A->nrow; ++j) {
		rcmin = SUPERLU_MIN(rcmin, R[j]);
		rcmax = SUPERLU_MAX(rcmax, R[j]);
	    }
	    if (rcmin <= 0.) *info = -7;
	    else if ( A->nrow > 0)
		rowcnd = SUPERLU_MAX(rcmin,smlnum) / SUPERLU_MIN(rcmax,bignum);
	    else rowcnd = 1.;
	}
	if (colequ && *info == 0) {
	    rcmin = bignum;
	    rcmax = 0.;
	    for (j = 0; j < A->nrow; ++j) {
		rcmin = SUPERLU_MIN(rcmin, C[j]);
		rcmax = SUPERLU_MAX(rcmax, C[j]);
	    }
	    if (rcmin <= 0.) *info = -8;
	    else if (A->nrow > 0)
		colcnd = SUPERLU_MAX(rcmin,smlnum) / SUPERLU_MIN(rcmax,bignum);
	    else colcnd = 1.;
	}
	if (*info == 0) {
	    if ( lwork < -1 ) *info = -12;
	    else if ( B->ncol < 0 ) *info = -13;
	    else if ( B->ncol > 0 ) { /* no checking if B->ncol=0 */
	         if ( Bstore->lda < SUPERLU_MAX(0, A->nrow) ||
		      B->Stype != SLU_DN || B->Dtype != SLU_Z || 
		      B->Mtype != SLU_GE )
		*info = -13;
            }
	    if ( X->ncol < 0 ) *info = -14;
            else if ( X->ncol > 0 ) { /* no checking if X->ncol=0 */
                 if ( Xstore->lda < SUPERLU_MAX(0, A->nrow) ||
		      (B->ncol != 0 && B->ncol != X->ncol) ||
                      X->Stype != SLU_DN ||
		      X->Dtype != SLU_Z || X->Mtype != SLU_GE )
		*info = -14;
            }
	}
    }
    if (*info != 0) {
	i = -(*info);
	input_error("zgssvx", &i);
	return;
    }
    
    /* Initialization for factor parameters */
    panel_size = sp_ienv(1);
    relax      = sp_ienv(2);

    utime = stat->utime;
    
    /* Convert A to SLU_NC format when necessary. */
    if ( A->Stype == SLU_NR ) {
	NRformat *Astore = A->Store;
	AA = (SuperMatrix *) SUPERLU_MALLOC( sizeof(SuperMatrix) );
	zCreate_CompCol_Matrix(AA, A->ncol, A->nrow, Astore->nnz, 
			       Astore->nzval, Astore->colind, Astore->rowptr,
			       SLU_NC, A->Dtype, A->Mtype);
	if ( notran ) { /* Reverse the transpose argument. */
	    trant = TRANS;
	    notran = 0;
	} else {
	    trant = NOTRANS;
	    notran = 1;
	}
    } else { /* A->Stype == SLU_NC */
	trant = options->Trans;
	AA = A;
    }

    if ( nofact && equil ) {
	t0 = SuperLU_timer_();
	/* Compute row and column scalings to equilibrate the matrix A. */
	zgsequ(AA, R, C, &rowcnd, &colcnd, &amax, &info1);
	
	if ( info1 == 0 ) {
	    /* Equilibrate matrix A. */
	    zlaqgs(AA, R, C, rowcnd, colcnd, amax, equed);
	    rowequ = strncmp(equed, "R", 1)==0 || strncmp(equed, "B", 1)==0;
	    colequ = strncmp(equed, "C", 1)==0 || strncmp(equed, "B", 1)==0;
	}
	utime[EQUIL] = SuperLU_timer_() - t0;
    }


    if ( nofact ) {
	
        t0 = SuperLU_timer_();
	/*
	 * Gnet column permutation vector perm_c[], according to permc_spec:
	 *   permc_spec = NATURAL:  natural ordering 
	 *   permc_spec = MMD_AT_PLUS_A: minimum degree on structure of A'+A
	 *   permc_spec = MMD_ATA:  minimum degree on structure of A'*A
	 *   permc_spec = COLAMD:   approximate minimum degree column ordering
	 *   permc_spec = MY_PERMC: the ordering already supplied in perm_c[]
	 */
	permc_spec = options->ColPerm;
	if ( permc_spec != MY_PERMC && options->Fact == DOFACT )
            get_perm_c(permc_spec, AA, perm_c);
	utime[COLPERM] = SuperLU_timer_() - t0;

	t0 = SuperLU_timer_();
	sp_preorder(options, AA, perm_c, etree, &AC);
	utime[ETREE] = SuperLU_timer_() - t0;
    
/*	printf("Factor PA = LU ... relax %d\tw %d\tmaxsuper %d\trowblk %d\n", 
	       relax, panel_size, sp_ienv(3), sp_ienv(4));
	fflush(stdout); */
	
	/* Compute the LU factorization of A*Pc. */
	t0 = SuperLU_timer_();
	zgstrf(options, &AC, relax, panel_size, etree,
                work, lwork, perm_c, perm_r, L, U, Glu, stat, info);
	utime[FACT] = SuperLU_timer_() - t0;
	
	if ( lwork == -1 ) {
	    mem_usage->total_needed = *info - A->ncol;
	    return;
	}
    }

    if ( *info > 0 ) { 
        if ( *info <= A->ncol ) { /* singular */
	    /* Compute the reciprocal pivot growth factor of the leading
	       rank-deficient (*info) columns of A. */
	    *recip_pivot_growth = zPivotGrowth(*info, AA, perm_c, L, U);
        }
	return;
    }

    /* *info == 0 at this point. */

    if ( options->PivotGrowth ) {
        /* Compute the reciprocal pivot growth factor *recip_pivot_growth. */
        *recip_pivot_growth = zPivotGrowth(A->ncol, AA, perm_c, L, U);
    }

    if ( options->ConditionNumber ) {
        /* Estimate the reciprocal of the condition number of A. */
        t0 = SuperLU_timer_();
        if ( notran ) {
	    *(unsigned char *)norm = '1';
        } else {
	    *(unsigned char *)norm = 'I';
        }
        anorm = zlangs(norm, AA);
        zgscon(norm, L, U, anorm, rcond, stat, &info1);
        utime[RCOND] = SuperLU_timer_() - t0;
    }
    
    if ( nrhs > 0 ) {
        /* Scale the right hand side if equilibration was performed. */
        if ( notran ) {
	    if ( rowequ ) {
	        for (j = 0; j < nrhs; ++j)
		    for (i = 0; i < A->nrow; ++i)
                        zd_mult(&Bmat[i+j*ldb], &Bmat[i+j*ldb], R[i]);
	    }
        } else if ( colequ ) {
	    for (j = 0; j < nrhs; ++j)
	        for (i = 0; i < A->nrow; ++i)
                    zd_mult(&Bmat[i+j*ldb], &Bmat[i+j*ldb], C[i]);
        }

        /* Compute the solution matrix X. */
        for (j = 0; j < nrhs; j++)  /* Save a copy of the right hand sides */
            for (i = 0; i < B->nrow; i++)
	        Xmat[i + j*ldx] = Bmat[i + j*ldb];
    
        t0 = SuperLU_timer_();
        zgstrs (trant, L, U, perm_c, perm_r, X, stat, &info1);
        utime[SOLVE] = SuperLU_timer_() - t0;
    
        /* Use iterative refinement to improve the computed solution and compute
           error bounds and backward error estimates for it. */
        t0 = SuperLU_timer_();
        if ( options->IterRefine != NOREFINE ) {
            zgsrfs(trant, AA, L, U, perm_c, perm_r, equed, R, C, B,
                   X, ferr, berr, stat, &info1);
        } else {
            for (j = 0; j < nrhs; ++j) ferr[j] = berr[j] = 1.0;
        }
        utime[REFINE] = SuperLU_timer_() - t0;

        /* Transform the solution matrix X to a solution of the original system. */
        if ( notran ) {
	    if ( colequ ) {
	        for (j = 0; j < nrhs; ++j)
		    for (i = 0; i < A->nrow; ++i)
                        zd_mult(&Xmat[i+j*ldx], &Xmat[i+j*ldx], C[i]);
	    }
        } else if ( rowequ ) {
	    for (j = 0; j < nrhs; ++j)
	        for (i = 0; i < A->nrow; ++i)
                    zd_mult(&Xmat[i+j*ldx], &Xmat[i+j*ldx], R[i]);
        }
    } /* end if nrhs > 0 */

    if ( options->ConditionNumber ) {
        /* Set INFO = A->ncol+1 if the matrix is singular to working precision. */
        /*if ( *rcond < dlamch_("E") ) *info = A->ncol + 1;*/
        if ( *rcond < dmach("E") ) *info = A->ncol + 1;
    }

    if ( nofact ) {
        zQuerySpace(L, U, mem_usage);
        Destroy_CompCol_Permuted(&AC);
    }
    if ( A->Stype == SLU_NR ) {
	Destroy_SuperMatrix_Store(AA);
	SUPERLU_FREE(AA);
    }

}